

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O2

void jpeg_add_quant_table
               (j_compress_ptr cinfo,int which_tbl,uint *basic_table,int scale_factor,
               boolean force_baseline)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  JQUANT_TBL *pJVar3;
  long lVar4;
  UINT16 UVar5;
  long lVar6;
  
  iVar1 = cinfo->global_state;
  if (iVar1 != 100) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = iVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (3 < (uint)which_tbl) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x20;
    (pjVar2->msg_parm).i[0] = which_tbl;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pJVar3 = cinfo->quant_tbl_ptrs[which_tbl];
  if (pJVar3 == (JQUANT_TBL *)0x0) {
    pJVar3 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
    cinfo->quant_tbl_ptrs[which_tbl] = pJVar3;
  }
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
    lVar4 = (long)((ulong)basic_table[lVar6] * (long)scale_factor + 0x32) / 100;
    if (lVar4 < 2) {
      lVar4 = 1;
    }
    if (0x7ffe < lVar4) {
      lVar4 = 0x7fff;
    }
    UVar5 = (UINT16)lVar4;
    if (0x63cd < (long)((ulong)basic_table[lVar6] * (long)scale_factor)) {
      UVar5 = 0xff;
    }
    if (force_baseline == 0) {
      UVar5 = (UINT16)lVar4;
    }
    pJVar3->quantval[lVar6] = UVar5;
  }
  pJVar3->sent_table = 0;
  return;
}

Assistant:

GLOBAL(void)
jpeg_add_quant_table (j_compress_ptr cinfo, int which_tbl,
		      const unsigned int *basic_table,
		      int scale_factor, boolean force_baseline)
/* Define a quantization table equal to the basic_table times
 * a scale factor (given as a percentage).
 * If force_baseline is TRUE, the computed quantization table entries
 * are limited to 1..255 for JPEG baseline compatibility.
 */
{
  JQUANT_TBL ** qtblptr;
  int i;
  long temp;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (which_tbl < 0 || which_tbl >= NUM_QUANT_TBLS)
    ERREXIT1(cinfo, JERR_DQT_INDEX, which_tbl);

  qtblptr = & cinfo->quant_tbl_ptrs[which_tbl];

  if (*qtblptr == NULL)
    *qtblptr = jpeg_alloc_quant_table((j_common_ptr) cinfo);

  for (i = 0; i < DCTSIZE2; i++) {
    temp = ((long) basic_table[i] * scale_factor + 50L) / 100L;
    /* limit the values to the valid range */
    if (temp <= 0L) temp = 1L;
    if (temp > 32767L) temp = 32767L; /* max quantizer needed for 12 bits */
    if (force_baseline && temp > 255L)
      temp = 255L;		/* limit to baseline range if requested */
    (*qtblptr)->quantval[i] = (UINT16) temp;
  }

  /* Initialize sent_table FALSE so table will be written to JPEG file. */
  (*qtblptr)->sent_table = FALSE;
}